

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::set_value(Model *this)

{
  int iVar1;
  index_t iVar2;
  char *in_RDI;
  result_type_conflict rVar3;
  float fVar4;
  __type _Var5;
  index_t j_4;
  index_t s;
  index_t d_3;
  index_t f;
  index_t j_3;
  real_t coef_1;
  real_t *w_1;
  index_t k_aligned_1;
  index_t d_2;
  index_t d_1;
  index_t d;
  index_t j_2;
  real_t *w;
  real_t coef;
  index_t k_aligned;
  index_t j_1;
  index_t j;
  index_t i;
  uniform_real_distribution<float> dis;
  default_random_engine generator;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float fVar6;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  float *local_58;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  float *local_38;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x13e539);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff6c
             ,in_stack_ffffffffffffff68);
  for (local_1c = 0; local_1c < *(uint *)(in_RDI + 0x40);
      local_1c = *(int *)(in_RDI + 0x54) + local_1c) {
    *(undefined4 *)(*(long *)(in_RDI + 0x58) + (ulong)local_1c * 4) = 0;
    for (local_20 = 1; local_20 < *(uint *)(in_RDI + 0x54); local_20 = local_20 + 1) {
      *(undefined4 *)(*(long *)(in_RDI + 0x58) + (ulong)(local_1c + local_20) * 4) = 0x3f800000;
    }
  }
  **(undefined4 **)(in_RDI + 0x68) = 0;
  for (local_24 = 1; local_24 < *(uint *)(in_RDI + 0x54); local_24 = local_24 + 1) {
    *(undefined4 *)(*(long *)(in_RDI + 0x68) + (ulong)local_24 * 4) = 0x3f800000;
  }
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 == 0) {
    iVar2 = get_aligned_k((Model *)0x13e647);
    _Var5 = std::sqrt<unsigned_int>(0);
    fVar4 = *(float *)(in_RDI + 0x88);
    local_38 = *(float **)(in_RDI + 0x60);
    for (local_3c = 0; local_3c < *(uint *)(in_RDI + 0x48); local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < *(uint *)(in_RDI + 0x50); local_40 = local_40 + 1) {
        rVar3 = std::uniform_real_distribution<float>::operator()
                          ((uniform_real_distribution<float> *)
                           CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        *local_38 = (float)((1.0 / _Var5) * (double)fVar4) * rVar3;
        local_38 = local_38 + 1;
      }
      for (local_44 = *(uint *)(in_RDI + 0x50); local_48 = iVar2, local_44 < iVar2;
          local_44 = local_44 + 1) {
        *local_38 = 0.0;
        local_38 = local_38 + 1;
      }
      for (; local_48 < *(int *)(in_RDI + 0x54) * iVar2; local_48 = local_48 + 1) {
        *local_38 = 1.0;
        local_38 = local_38 + 1;
      }
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare(in_RDI);
    if (iVar1 == 0) {
      iVar2 = get_aligned_k((Model *)0x13e7d7);
      local_58 = *(float **)(in_RDI + 0x60);
      _Var5 = std::sqrt<unsigned_int>(0);
      fVar4 = (float)((1.0 / _Var5) * (double)*(float *)(in_RDI + 0x88));
      for (local_60 = 0; local_60 < *(uint *)(in_RDI + 0x48); local_60 = local_60 + 1) {
        for (local_64 = 0; local_64 < *(uint *)(in_RDI + 0x4c); local_64 = local_64 + 1) {
          local_68 = 0;
          while (local_68 < iVar2) {
            for (local_6c = 0; local_6c < 4; local_6c = local_6c + 1) {
              if (local_68 < *(uint *)(in_RDI + 0x50)) {
                fVar6 = fVar4;
                rVar3 = std::uniform_real_distribution<float>::operator()
                                  ((uniform_real_distribution<float> *)
                                   CONCAT44(fVar4,in_stack_ffffffffffffff70),
                                   (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>
                                    *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68))
                ;
                fVar6 = fVar6 * rVar3;
              }
              else {
                fVar6 = 0.0;
              }
              *local_58 = fVar6;
              for (local_70 = 1; local_70 < *(uint *)(in_RDI + 0x54); local_70 = local_70 + 1) {
                local_58[local_70 << 2] = 1.0;
              }
              local_58 = local_58 + 1;
              local_68 = local_68 + 1;
            }
            local_58 = local_58 + (uint)((*(int *)(in_RDI + 0x54) + -1) * 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Model::set_value() {
  // Use distribution to transform the random unsigned
  // int generated by gen into a float in [(0.0, 1.0) * coef]
  std::default_random_engine generator;
  std::uniform_real_distribution<real_t> dis(0.0, 1.0);
  /*********************************************************
   *  Initialize linear and bias term                      *
   *********************************************************/
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    param_w_[i] = 0.0;        /* model */
    for (index_t j = 1; j < aux_size_; ++j) {
      param_w_[i+j] = 1.0;    /* gradient cache */
    }
  }
  param_b_[0] = 0.0;      /* model */
  for (index_t j = 1; j < aux_size_; ++j) {
    param_b_[j] = 1.0;    /* gradient cache */
  }
  /*********************************************************
   *  Initialize latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for(index_t d = 0; d < num_K_; d++, w++) {
        *w = coef * dis(generator);  /* model */
      }
      for(index_t d = num_K_; d < k_aligned; d++, w++) {
        *w = 0;  /* Beyond aligned number */
      }
      for(index_t d = k_aligned; d < aux_size_*k_aligned; d++, w++) {
        *w = 1.0;  /* gradient cache */
      }
    }
  }
  /*********************************************************
   *  Initialize latent factor for ffm                     *
   *********************************************************/
  else if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            w[0] = (d < num_K_) ? coef * dis(generator) : 0.0; /* model */
            for (index_t j = 1; j < aux_size_; ++j) {
              w[kAlign * j] = 1.0; /* gradient cache */
            }
          }
          w += (aux_size_-1) * kAlign;
        }
      }
    }
  }
}